

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdSignSchnorr(void *handle,char *msg,char *sk,char *aux_rand,char **signature)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  SchnorrSignature schnorr_sig;
  int result;
  string *in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffc70;
  allocator *paVar4;
  string *in_stack_fffffffffffffcb0;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  ByteData256 local_2a8;
  allocator local_289;
  string local_288;
  Privkey local_268;
  allocator local_241;
  string local_240;
  ByteData256 local_220;
  SchnorrSignature local_208;
  allocator local_1d9;
  string local_1d8;
  Privkey local_1b8;
  string local_191;
  ByteData256 local_170;
  SchnorrSignature local_158;
  SchnorrSignature local_130;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  undefined4 local_34;
  undefined8 *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  local_34 = 0xffffffff;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x26c;
    local_60.funcname = "CfdSignSchnorr";
    cfd::core::logger::warn<>(&local_60,"msg is null or empty.");
    local_82 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. msg is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc70,error_code,in_stack_fffffffffffffc60);
    local_82 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    if (local_30 == (undefined8 *)0x0) {
      local_e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                   ,0x2f);
      local_e0.filename = local_e0.filename + 1;
      local_e0.line = 0x278;
      local_e0.funcname = "CfdSignSchnorr";
      cfd::core::logger::warn<>(&local_e0,"signature is null.");
      local_102 = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"Failed to parameter. signature is null.",&local_101);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffc70,error_code,in_stack_fffffffffffffc60);
      local_102 = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::SchnorrSignature::SchnorrSignature(&local_130);
    bVar1 = cfd::capi::IsEmptyString(local_28);
    if (bVar1) {
      in_stack_fffffffffffffcb0 = &local_191;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_191.field_0x1,local_18,(allocator *)in_stack_fffffffffffffcb0);
      cfd::core::ByteData256::ByteData256(&local_170,(string *)&local_191.field_0x1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d8,local_20,&local_1d9);
      cfd::core::Privkey::Privkey(&local_1b8,&local_1d8,kMainnet,true);
      cfd::core::SchnorrUtil::Sign(&local_158,&local_170,&local_1b8);
      cfd::core::SchnorrSignature::operator=(&local_130,&local_158);
      cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x5d080d);
      cfd::core::Privkey::~Privkey((Privkey *)0x5d081a);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5d0841);
      std::__cxx11::string::~string((string *)&local_191.field_0x1);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_240,local_18,&local_241);
      cfd::core::ByteData256::ByteData256(&local_220,&local_240);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_288,local_20,&local_289);
      cfd::core::Privkey::Privkey(&local_268,&local_288,kMainnet,true);
      paVar4 = &local_2c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2c8,local_28,paVar4);
      cfd::core::ByteData256::ByteData256(&local_2a8,&local_2c8);
      cfd::core::SchnorrUtil::Sign(&local_208,&local_220,&local_268,&local_2a8);
      cfd::core::SchnorrSignature::operator=(&local_130,&local_208);
      cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x5d0aa0);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5d0aad);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      cfd::core::Privkey::~Privkey((Privkey *)0x5d0ad4);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5d0afb);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
    }
    cfd::core::SchnorrSignature::GetHex_abi_cxx11_(&local_2f0,&local_130,false);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffcb0);
    *local_30 = pcVar3;
    std::__cxx11::string::~string((string *)&local_2f0);
    local_4 = 0;
    cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x5d0cbd);
    return local_4;
  }
  local_a0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_a0.filename = local_a0.filename + 1;
  local_a0.line = 0x272;
  local_a0.funcname = "CfdSignSchnorr";
  cfd::core::logger::warn<>(&local_a0,"sk is null or empty.");
  local_c2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Failed to parameter. sk is null or empty.",&local_c1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffc70,error_code,in_stack_fffffffffffffc60);
  local_c2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSignSchnorr(
    void* handle, const char* msg, const char* sk, const char* aux_rand,
    char** signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(sk)) {
      warn(CFD_LOG_SOURCE, "sk is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sk is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    SchnorrSignature schnorr_sig;
    if (IsEmptyString(aux_rand)) {
      schnorr_sig = SchnorrUtil::Sign(ByteData256(msg), Privkey(sk));
    } else {
      schnorr_sig = SchnorrUtil::Sign(
          ByteData256(msg), Privkey(sk), ByteData256(aux_rand));
    }

    *signature = CreateString(schnorr_sig.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}